

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

FuncVec * __thiscall dg::llvmdg::LazyLLVMCallGraph::callers(LazyLLVMCallGraph *this,Function *F)

{
  bool bVar1;
  reference ppFVar2;
  Function *in_RSI;
  LazyLLVMCallGraph *in_RDI;
  FuncNode *nd;
  const_iterator __end2;
  const_iterator __begin2;
  vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
  *__range2;
  FuncNode *fnd;
  FuncVec *ret;
  LazyLLVMCallGraph *__lhs;
  vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> *in_stack_ffffffffffffffa0
  ;
  FuncNode *this_00;
  GenericCallGraph<const_llvm::Function_*> *in_stack_ffffffffffffffa8;
  __normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
  local_50;
  vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
  *local_48;
  FuncNode *local_40;
  undefined1 local_19;
  Function *F_00;
  LazyLLVMCallGraph *this_01;
  
  local_19 = 0;
  __lhs = in_RDI;
  F_00 = in_RSI;
  this_01 = in_RDI;
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::vector
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)0x183c33);
  getCallsOf(this_01,F_00);
  std::vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>::~vector
            (in_stack_ffffffffffffffa0);
  local_40 = GenericCallGraph<const_llvm::Function_*>::get
                       (in_stack_ffffffffffffffa8,(Function **)in_stack_ffffffffffffffa0);
  local_48 = GenericCallGraph<const_llvm::Function_*>::FuncNode::getCallers(local_40);
  local_50._M_current =
       (FuncNode **)
       std::
       vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
       ::begin((vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
                *)in_RDI);
  std::
  vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
  ::end((vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
         *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
                             *)__lhs,(__normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
                                      *)in_RDI), bVar1) {
    ppFVar2 = __gnu_cxx::
              __normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
              ::operator*(&local_50);
    this_00 = *ppFVar2;
    GenericCallGraph<const_llvm::Function_*>::FuncNode::getValue(this_00);
    std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
              ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)this_00,
               (value_type *)in_RSI);
    __gnu_cxx::
    __normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
    ::operator++(&local_50);
  }
  return (FuncVec *)__lhs;
}

Assistant:

FuncVec callers(const llvm::Function *F) override {
        FuncVec ret;
        // make sure we have the callers
        // (this will find also caller functions)
        getCallsOf(F);

        auto fnd = _cg.get(F);
        assert(fnd);
        for (auto *nd : fnd->getCallers()) {
            ret.push_back(nd->getValue());
        }
        return ret;
    }